

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

int mqtt_client_send_message_response
              (MQTT_CLIENT_HANDLE handle,uint16_t packetId,QOS_VALUE qosValue)

{
  LOGGER_LOG p_Var1;
  MQTT_CLIENT *mqtt_client;
  int iVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,packetId) & 0xffffffff;
  if (handle == (MQTT_CLIENT_HANDLE)0x0 || (int)CONCAT62(in_register_00000032,packetId) == 0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x519;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"mqtt_client_send_message_response",0x518,1,
                "Invalid parameter specified mqtt_client: %p, packetId: %d",handle,uVar3);
    }
  }
  else {
    SendMessageAck(handle,(uint16_t)uVar3,qosValue);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mqtt_client_send_message_response(MQTT_CLIENT_HANDLE handle, uint16_t packetId, QOS_VALUE qosValue)
{
    int result;

    if (handle == NULL || packetId == 0)
    {
        LogError("Invalid parameter specified mqtt_client: %p, packetId: %d", handle, packetId);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        SendMessageAck(mqtt_client, packetId, qosValue);
        result = 0;
    }

    return result;
}